

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOWFileParser.cpp
# Opt level: O2

void __thiscall BOWFileParser::readBOWFile(BOWFileParser *this)

{
  BOWFileParser *pBVar1;
  int iVar2;
  istream *piVar3;
  int iVar4;
  bool bVar5;
  uint local_21c;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_218;
  BOWFileParser *local_210;
  string token;
  vector<unsigned_int,_std::allocator<unsigned_int>_> intVec;
  string str;
  istringstream stream;
  
  if (((&this->field_0x20)[*(long *)(*(long *)this + -0x18)] & 5) == 0) {
    str._M_dataplus._M_p = (pointer)&str.field_2;
    str._M_string_length = 0;
    str.field_2._M_local_buf[0] = '\0';
    local_218 = &this->_frequencyMatrix;
    iVar2 = 0;
    local_210 = this;
    while( true ) {
      pBVar1 = local_210;
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_210,(string *)&str);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      intVec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      intVec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      intVec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      token._M_dataplus._M_p = (pointer)&token.field_2;
      token._M_string_length = 0;
      token.field_2._M_local_buf[0] = '\0';
      std::__cxx11::istringstream::istringstream((istringstream *)&stream,(string *)&str,_S_in);
      if (iVar2 == 0) {
        iVar4 = 0;
        while( true ) {
          piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)&stream,(string *)&token,',');
          if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
          bVar5 = iVar4 != 0;
          iVar4 = iVar4 + -1;
          if (bVar5) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&this->_wordList,&token);
          }
        }
      }
      else {
        iVar4 = 0;
        while( true ) {
          piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)&stream,(string *)&token,',');
          if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
          bVar5 = iVar4 != 0;
          iVar4 = iVar4 + -1;
          if (bVar5) {
            local_21c = std::__cxx11::stoi(&token,(size_t *)0x0,10);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       &intVec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
                       &local_21c);
          }
        }
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::push_back(local_218,
                    (value_type *)
                    &intVec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)&stream);
      std::__cxx11::string::~string((string *)&token);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&intVec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      iVar2 = iVar2 + 1;
    }
    pBVar1->_V = (uint)((ulong)((long)(pBVar1->_wordList).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pBVar1->_wordList).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 5);
    std::__cxx11::string::~string((string *)&str);
    return;
  }
  std::operator<<((ostream *)&std::cout,"Cannot open BOWfile");
  exit(1);
}

Assistant:

void BOWFileParser::readBOWFile(){//{{{
    if(!_inputText){
        cout<<"Cannot open BOWfile";
        exit(1);
    }
    string str;
    for(int i=0;getline(_inputText,str);i++){
        vector<unsigned int > intVec;
        string token;
        istringstream stream(str);

        if(i==0){
            for(int j=0;getline(stream,token,',');j++){
                if(j==0)continue;
                _wordList.push_back(token);
            }
            continue;
        }
        for(int j=0;getline(stream,token,',');j++){
            if(j==0)continue;
            intVec.push_back(stoi(token));
        }
        _frequencyMatrix.push_back(intVec);
    }

    _V = _wordList.size();
}